

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

plutosvg_document_t *
plutosvg_document_create(float width,float height,plutovg_destroy_func_t destroy_func,void *closure)

{
  plutosvg_document_t *ppVar1;
  heap_t *phVar2;
  plutovg_path_t *ppVar3;
  plutosvg_document_t *document;
  void *closure_local;
  plutovg_destroy_func_t destroy_func_local;
  float height_local;
  float width_local;
  
  ppVar1 = (plutosvg_document_t *)malloc(0x38);
  phVar2 = heap_create();
  ppVar1->heap = phVar2;
  ppVar3 = plutovg_path_create();
  ppVar1->path = ppVar3;
  ppVar1->id_cache = (hashmap_t *)0x0;
  ppVar1->root_element = (element_t *)0x0;
  ppVar1->destroy_func = destroy_func;
  ppVar1->closure = closure;
  ppVar1->width = width;
  ppVar1->height = height;
  return ppVar1;
}

Assistant:

static plutosvg_document_t* plutosvg_document_create(float width, float height, plutovg_destroy_func_t destroy_func, void* closure)
{
    plutosvg_document_t* document = malloc(sizeof(plutosvg_document_t));
    document->heap = heap_create();
    document->path = plutovg_path_create();
    document->id_cache = NULL;
    document->root_element = NULL;
    document->destroy_func = destroy_func;
    document->closure = closure;
    document->width = width;
    document->height = height;
    return document;
}